

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

int Wlc_NtkMarkMffc(Wlc_Ntk_t *p,Wlc_Obj_t *pNode,Vec_Bit_t *vUnmark)

{
  int iVar1;
  int iVar2;
  int Count2;
  int Count1;
  Vec_Bit_t *vUnmark_local;
  Wlc_Obj_t *pNode_local;
  Wlc_Ntk_t *p_local;
  
  vUnmark_local = (Vec_Bit_t *)pNode;
  while( true ) {
    iVar1 = Wlc_ObjIsCi((Wlc_Obj_t *)vUnmark_local);
    if (iVar1 == 0) break;
    iVar1 = Wlc_ObjId(p,(Wlc_Obj_t *)vUnmark_local);
    Vec_BitWriteEntry(vUnmark,iVar1,1);
    vUnmark_local = (Vec_Bit_t *)Wlc_ObjFo2Fi(p,(Wlc_Obj_t *)vUnmark_local);
  }
  iVar1 = Wlc_ObjIsCi((Wlc_Obj_t *)vUnmark_local);
  if (iVar1 == 0) {
    iVar1 = Wlc_NtkNodeDeref_rec(p,(Wlc_Obj_t *)vUnmark_local,vUnmark);
    iVar2 = Wlc_NtkNodeRef_rec(p,(Wlc_Obj_t *)vUnmark_local);
    if (iVar1 == iVar2) {
      return iVar1;
    }
    __assert_fail("Count1 == Count2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs2.c"
                  ,0x111,"int Wlc_NtkMarkMffc(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Bit_t *)");
  }
  __assert_fail("!Wlc_ObjIsCi(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs2.c"
                ,0x10c,"int Wlc_NtkMarkMffc(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Bit_t *)");
}

Assistant:

static int Wlc_NtkMarkMffc( Wlc_Ntk_t * p, Wlc_Obj_t * pNode, Vec_Bit_t * vUnmark )
{
    int Count1, Count2;
    // if this is a flop output, compute MFFC of the corresponding flop input
    while ( Wlc_ObjIsCi(pNode) )
    {
        Vec_BitWriteEntry( vUnmark, Wlc_ObjId(p, pNode), 1 );
        pNode = Wlc_ObjFo2Fi(p, pNode);
    }
    assert( !Wlc_ObjIsCi(pNode) );
    // dereference the node (and set the bits in vUnmark)
    Count1 = Wlc_NtkNodeDeref_rec( p, pNode, vUnmark );
    // reference it back
    Count2 = Wlc_NtkNodeRef_rec( p, pNode );
    assert( Count1 == Count2 );
    return Count1;
}